

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-prepared.c
# Opt level: O2

char * borg_prepared(wchar_t depth)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  monster_race *pmVar5;
  _Bool _Var6;
  char *pcVar7;
  wchar_t wVar8;
  char *fmt;
  int iVar9;
  ulong uVar10;
  
  if (depth == L'\x01') {
    return (char *)0x0;
  }
  iVar9 = borg_cfg[0xd];
  pcVar7 = borg_restock(depth);
  if (iVar9 == 0) {
    if (pcVar7 != (char *)0x0) {
      return pcVar7;
    }
    wVar8 = borg.trait[0x24];
    if (wVar8 < depth && wVar8 < L'2') {
      return "Clevel < depth";
    }
    if (depth < L'd') {
      if (borg.ready_morgoth == L'\xffffffff') {
        borg.ready_morgoth = L'\0';
      }
      if (borg.trait[0x6b] == 0) {
        if (depth != L'\0') {
          if (borg.trait[0x1a] < 1) {
            return "1 Lite";
          }
          if (borg.trait[0x27] < 5) {
            return "5 Food";
          }
          if (L'\x01' < depth) {
            iVar9 = borg_cfg[10];
            if (iVar9 == 0) {
              uVar1 = borg.trait[0x1c];
              if ((int)uVar1 < 0x1e) {
                return "30 hp";
              }
              if (depth != L'\x02') {
                switch(borg.trait[0x19]) {
                case 0:
                case 5:
                case 7:
                case 8:
                  if (uVar1 < 0x32) {
                    return "50 hp";
                  }
                  if (wVar8 < L'\x04') {
                    return "4 clevel";
                  }
                  break;
                case 1:
                case 4:
                  if (uVar1 < 0x3c) {
                    return "60 hp";
                  }
                  if (wVar8 < L'\v') {
                    return "11 clevel";
                  }
                  break;
                case 2:
                case 3:
                  if (uVar1 < 0x28) {
                    return "40 hp";
                  }
                  if (wVar8 < L'\t') {
                    return "9 level";
                  }
                  break;
                case 6:
                  if (uVar1 < 0x32) {
                    return "50 hp";
                  }
                  if (wVar8 < L'\b') {
                    return "8 clevel";
                  }
                }
                goto switchD_002299af_default;
              }
            }
            else if (depth != L'\x02') {
switchD_002299af_default:
              if ((wVar8 < L'\x1e') && (borg.trait[0xe8] + borg.trait[0xe9] + borg.trait[0xe7] < 2))
              {
                return "2 cure";
              }
              if (4 < (uint)depth) {
                if ((iVar9 == 0) && (borg.trait[0x69] != 0)) {
                  pcVar7 = "60 hp";
                  switch(borg.trait[0x19]) {
                  case 0:
                  case 5:
                  case 7:
                  case 8:
                    if (borg.trait[0x1c] < 0x3c) {
                      return pcVar7;
                    }
                    if (wVar8 < L'\x06') {
                      return "6 clevel";
                    }
                    break;
                  case 1:
                  case 4:
                    if (borg.trait[0x1c] < 0x50) {
                      return "80 hp";
                    }
                    if (wVar8 < L'\x0f') {
                      return "15 level";
                    }
                    break;
                  case 2:
                  case 3:
                    if (borg.trait[0x1c] < 0x3c) {
                      return pcVar7;
                    }
                    if (wVar8 < L'\x0f') {
                      return "15 clevel";
                    }
                    break;
                  case 6:
                    if (borg.trait[0x1c] < 0x3c) {
                      return pcVar7;
                    }
                    if (wVar8 < L'\n') {
                      return "10 clevel";
                    }
                  }
                }
                if ((wVar8 < L'\x1e') &&
                   (borg.trait[0xe8] + borg.trait[0xe9] + borg.trait[0xe7] < 2)) {
                  return "2 cures (clw + csw + ccw)";
                }
                if (borg.trait[0x26] < 1) {
                  return "1 recall";
                }
                if (9 < (uint)depth) {
                  if ((borg.trait[0x1a] == 1) && (borg.trait[0x19] != 4)) {
                    return "2 light radius";
                  }
                  if (borg.trait[0xd4] + borg.trait[0xd3] < 2) {
                    return "2 tele + teleport staffs";
                  }
                  if (iVar9 == 0) {
                    switch(borg.trait[0x19]) {
                    case 0:
                    case 8:
                      if ((uint)depth < 0x14 && wVar8 < depth + L'\xfffffffc') {
                        return "dlevel - 4 >= clevel";
                      }
                      break;
                    case 1:
                    case 4:
                      if (wVar8 < depth + L'\x05' && wVar8 < L'\x1d') {
                        return "dlevel + 5 > = clevel";
                      }
                      break;
                    case 2:
                    case 3:
                    case 5:
                    case 6:
                    case 7:
                      if ((uint)depth < 0x14 && wVar8 < depth) {
                        return "dlevel >= clevel";
                      }
                    }
                  }
                  if ((wVar8 < L'\x1e') && (borg.trait[0xe7] < 3)) {
                    return "ccw < 3";
                  }
                  if (((borg.trait[0x33] == 0) && (borg.trait[0x103] == 0)) &&
                     (borg.trait[0x25] == 0)) {
                    return "See Invis : ESP";
                  }
                  if (0x13 < (uint)depth) {
                    if (borg.trait[0x56] == 0) {
                      return "free action";
                    }
                    if (depth != L'\x14') {
                      if (borg.trait[0x57] == 0) {
                        return "resist fire";
                      }
                      if (borg.trait[0x46] + borg.trait[0x48] + borg.trait[0x47] < 2) {
                        return "2 basic resists";
                      }
                      if (*borg.trait < 7) {
                        return "low STR";
                      }
                      wVar8 = borg_spell_stat();
                      if ((wVar8 != L'\xffffffff') && (borg.trait[wVar8] < 7)) {
                        return "low spell stat";
                      }
                      uVar1 = borg.trait[3];
                      if ((int)uVar1 < 7) {
                        return "low DEX";
                      }
                      uVar2 = borg.trait[4];
                      if ((int)uVar2 < 7) {
                        return "low CON";
                      }
                      iVar9 = borg_cfg[10];
                      if (iVar9 == 0) {
                        switch(borg.trait[0x19]) {
                        case 0:
                        case 8:
                          if (borg.trait[0x24] < depth + L'\x05' && borg.trait[0x24] < 0x27) {
                            return "dlevel + 5 >= clevel";
                          }
                          break;
                        case 1:
                        case 4:
                          iVar3 = borg.trait[0x24];
                          if (iVar3 < depth + L'\b' && iVar3 < 0x27) {
LAB_00229efd:
                            return "dlevel + 8 >= clevel";
                          }
                          if ((iVar3 - 0x27U < 6) && (iVar3 * 2 + L'\xffffffd2' < depth)) {
                            return "(clevel-38)*2+30 < dlevel";
                          }
                          break;
                        case 2:
                        case 3:
                          if (borg.trait[0x24] < depth + L'\r' && borg.trait[0x24] < 0x2f) {
                            return "dlevel + 13 >= clevel";
                          }
                          break;
                        case 5:
                          if (borg.trait[0x24] < depth + L'\a' && borg.trait[0x24] < 0x29) {
                            return "dlevel + 7 >= clevel";
                          }
                          break;
                        case 6:
                          if (borg.trait[0x24] < depth + L'\n' && borg.trait[0x24] < 0x2c) {
                            return "dlevel + 10 >= clevel";
                          }
                          break;
                        case 7:
                          if (borg.trait[0x24] < depth + L'\b' && borg.trait[0x24] - 0x1dU < 0xd)
                          goto LAB_00229efd;
                        }
                      }
                      if (0x19 < (uint)depth) {
                        if (borg.trait[0x58] == 0) {
                          return "resist cold";
                        }
                        if (borg.trait[0x59] == 0) {
                          return "resist elec";
                        }
                        if (borg.trait[0x5a] == 0) {
                          return "resist acid";
                        }
                        if (borg.trait[0xd4] + borg.trait[0xd3] < 6) {
                          return "6 tell + telep staffs";
                        }
                        iVar3 = borg.trait[0x24];
                        if ((iVar3 < 0x1e) && (borg.trait[0xe8] + borg.trait[0xe7] < 10)) {
                          return "10 ccw + csw";
                        }
                        if (0x21 < (uint)depth) {
                          if (iVar9 == 0 && iVar3 < 0x28) {
                            return "level 40";
                          }
                          if (0x27 < (uint)depth) {
                            if (borg.trait[0x5b] == 0) {
                              return "resist pois";
                            }
                            if (borg.trait[0x60] == 0) {
                              return "resist conf";
                            }
                            if (*borg.trait < 0x10) {
                              return "STR < 16";
                            }
                            if ((wVar8 != L'\xffffffff') && (borg.trait[wVar8] < 0x10)) {
                              return "spell stat < 16";
                            }
                            if (uVar1 < 0x10) {
                              return "dex < 16";
                            }
                            if (uVar2 < 0x10) {
                              return "con < 16";
                            }
                            if (0x2d < (uint)depth) {
                              uVar4 = borg.trait[0x2c];
                              if ((int)uVar4 < 0x73) {
                                return "+5 speed";
                              }
                              if ((borg.trait[0xd6] < 1) && (borg.trait[0xd7] < 1)) {
                                return "1 heal";
                              }
                              if ((iVar9 == 0) && (borg.trait[0x1c] < 500)) {
                                return "HP 500";
                              }
                              if ((uint)*borg.trait < 0x3a) {
                                return "str < 18(40)";
                              }
                              if ((wVar8 != L'\xffffffff') && (borg.trait[wVar8] < 0x76)) {
                                return "spell stat needs to be max";
                              }
                              if (uVar1 < 0x4e) {
                                return "dex < 18 (60)";
                              }
                              if (uVar2 < 0x4e) {
                                return "con < 18 (60)";
                              }
                              if ((iVar3 < 0x32) && (borg.trait[0x67] == 0)) {
                                return "hold life";
                              }
                              if (0x37 < (uint)depth) {
                                if ((borg.trait[0xd6] < 2) && (borg.trait[0xd7] < 1)) {
                                  return "2 heal + *heal*";
                                }
                                if (borg.trait[0x5f] == 0) {
                                  return "resist blind";
                                }
                                if (borg.trait[0x25] == 0) {
                                  return "ESP";
                                }
                                if (0x3b < (uint)depth) {
                                  if (uVar4 < 0x78) {
                                    return "+10 speed";
                                  }
                                  if (borg.trait[0x65] == 0) {
                                    return "resist chaos";
                                  }
                                  if (borg.trait[0x66] == 0) {
                                    return "resist disenchant";
                                  }
                                  if (0x50 < (uint)depth && uVar4 < 0x82) {
                                    return "+20 Speed";
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        borg.ready_morgoth = L'\x01';
      }
    }
    wVar8 = borg_cfg[0x10];
    if (wVar8 <= depth) {
      pcVar7 = "No deeper %d.";
      goto LAB_002296fd;
    }
  }
  else {
    if (pcVar7 != (char *)0x0) {
      return pcVar7;
    }
    pcVar7 = borg_prepared_dynamic(depth);
    if (pcVar7 != (char *)0x0) {
      return pcVar7;
    }
  }
  if (borg.trait[0x6b] != 0) {
    return (char *)0x0;
  }
  if (borg.trait[0x69] == 0) {
    return (char *)0x0;
  }
  if (L'Q' < depth) {
    if (((int)num_life + (int)num_ezheal < 10) && (borg.trait[0xd8] + borg.trait[0xd7] < 10)) {
      borg_notice_home((borg_item_conflict *)0x0,false);
      wVar8 = L'\n' - num_ezheal;
LAB_0022978b:
      pcVar7 = "Scumming *Heal* potions (%d to go).";
LAB_002296fd:
      strnfmt(borg_prepared_buffer,0x400,pcVar7,(ulong)(uint)wVar8);
      return borg_prepared_buffer;
    }
    if (0x60 < borg.trait[0x6a]) {
      borg_notice_home((borg_item_conflict *)0x0,false);
      wVar8 = (int)num_life_true + (int)num_ezheal_true;
      iVar9 = wVar8 + borg.trait[0xd7] + borg.trait[0xd8];
      if (iVar9 < 0x1e) {
        wVar8 = L'\x1e' - iVar9;
        goto LAB_0022978b;
      }
      if ((0 < num_ezheal_true && borg.trait[0xd8] + borg.trait[0xd7] < 0x1e) &&
         (0x62 < borg.trait[0x6a])) {
        pcVar7 = "Collect from house (%d potions).";
        goto LAB_002296fd;
      }
    }
  }
  pmVar5 = r_info;
  if (borg.trait[0x6a] < 99) {
    if (borg_cfg[0xb] == 0) {
      return (char *)0x0;
    }
    if (borg_numb_live_unique < L'\x03') {
      return (char *)0x0;
    }
    if (depth <= borg_depth_hunted_unique) {
      return (char *)0x0;
    }
    pcVar7 = r_info[borg_first_living_unique].name;
    fmt = "Must kill %s.";
LAB_002298c8:
    strnfmt(borg_prepared_buffer,0x400,fmt,pcVar7);
    return borg_prepared_buffer;
  }
  if (L'a' < depth) {
    borg.ready_morgoth = L'\xffffffff';
    uVar10 = (ulong)borg_first_living_unique;
    if ((borg_numb_live_unique < L'\x01') || (borg_first_living_unique == borg_morgoth_id)) {
      if (depth != L'b') {
        borg.ready_morgoth = L'\x01';
      }
    }
    else if (((depth != L'b') || (borg.trait[0x6a] != 99)) ||
            ((_Var6 = borg_spell_legal_fail(TELEPORT_LEVEL,L'\x14'), !_Var6 &&
             (borg.trait[0xf7] < 1)))) {
      pcVar7 = pmVar5[uVar10].name;
      fmt = "%s still alive!";
      goto LAB_002298c8;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *borg_prepared(int depth)
{
    const char *reason;

    /* Town and First level */
    if (depth == 1)
        return ((char *)NULL);

    if (borg_cfg[BORG_USES_DYNAMIC_CALCS]) {

        /* use the base restock so special checks can be done */
        if ((reason = borg_restock(depth)))
            return reason;

        if ((reason = borg_prepared_dynamic(depth)))
            return reason;

    } else {
        /* Not prepared if I need to restock */
        if ((reason = borg_restock(depth)))
            return (reason);

        /*** Require his Clevel to be greater than or equal to Depth */
        if (borg.trait[BI_MAXCLEVEL] < depth && borg.trait[BI_MAXCLEVEL] < 50)
            return ("Clevel < depth");

        /* Must meet minimal requirements */
        if (depth <= 99) {
            if ((reason = borg_prepared_aux(depth)))
                return (reason);
        }

        /* Not if No_Deeper is set */
        if (depth >= borg_cfg[BORG_NO_DEEPER]) {
            strnfmt(borg_prepared_buffer, MAX_REASON, "No deeper %d.",
                borg_cfg[BORG_NO_DEEPER]);
            return (borg_prepared_buffer);
        }
    }

    /* Once Morgoth is dead */
    if (borg.trait[BI_KING]) {
        return ((char *)NULL);
    }

    /* Always okay from town */
    if (!borg.trait[BI_CDEPTH])
        return (reason);

    /* Scum on depth 80-81 for some *heal* potions */
    if (depth >= 82
        && ((num_ezheal + num_life) < 10
            && (borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 10)) {
        /* Must know exact number of Potions  in home */
        borg_notice_home(NULL, false);

        strnfmt(borg_prepared_buffer, MAX_REASON,
            "Scumming *Heal* potions (%d to go).", 10 - num_ezheal);
        return (borg_prepared_buffer);
    }

    /* Scum on depth 80-81 for lots of *Heal* potions preparatory for Endgame */
    if (depth >= 82 && borg.trait[BI_MAXDEPTH] >= 97) {
        /* Must know exact number of Potions  in home */
        borg_notice_home(NULL, false);

        /* Scum for 30*/
        int heals = num_ezheal_true + borg.trait[BI_AEZHEAL] + num_life_true
                    + borg.trait[BI_ALIFE];
        if (heals < 30) {
            strnfmt(borg_prepared_buffer, MAX_REASON,
                "Scumming *Heal* potions (%d to go).",
                30 - heals);
            return (borg_prepared_buffer);
        }

        /* Return to town to get your stock from the home */
        if ((borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 30 && heals >= 30
            && num_ezheal_true >= 1 && borg.trait[BI_MAXDEPTH] >= 99)
        {
            strnfmt(borg_prepared_buffer, MAX_REASON,
                "Collect from house (%d potions).",
                num_ezheal_true + num_life_true);
            return (borg_prepared_buffer);
        }
    }

    /* Check to make sure the borg does not go below where 3 living */
    /* uniques are. */
    if (borg.trait[BI_MAXDEPTH] <= 98) {
        struct monster_race *r_ptr;

        /* don't check how many uniques are alive */
        if (borg_cfg[BORG_KILLS_UNIQUES] == false)
            return ((char *)NULL);

        /* are too many uniques alive */
        if (borg_numb_live_unique < 3)
            return ((char *)NULL);

        /* Check for the dlevel of the unique */
        if (depth <= borg_depth_hunted_unique)
            return ((char *)NULL);

        /* To avoid double calls to format() */
        /* Reset our description for not diving */
        r_ptr = &r_info[borg_first_living_unique];
        strnfmt(borg_prepared_buffer, MAX_REASON, "Must kill %s.", r_ptr->name);
        return (borg_prepared_buffer);

    } else if (borg.trait[BI_MAXDEPTH] >= 98 && depth >= 98)
    /* check to make sure the borg does not go to level 100 */
    /* unless all the uniques are dead. */
    {
        struct monster_race *r_ptr;

        /* Access the living unique obtained from borg_update() */
        r_ptr = &r_info[borg_first_living_unique];

        /* -1 is unknown. */
        borg.ready_morgoth = -1;

        /* is only Morgoth alive? */
        if (borg_numb_live_unique < 1
            || borg_first_living_unique == borg_morgoth_id)
        {
            if (depth >= 99)
                borg.ready_morgoth = 1;
            return ((char *)NULL);
        }

        /* Under special cases allow the borg to dive to 99 then quickly
         * get his butt to dlevel 98
         */
        if (borg.trait[BI_MAXDEPTH] == 99 && depth <= 98
            && (borg_spell_legal_fail(TELEPORT_LEVEL, 20)
                || /* Teleport Level */
                borg.trait[BI_ATELEPORTLVL] >= 1)) /* Teleport Level scroll */
        {
            return ((char *)NULL);
        }

        /* To avoid double calls to format() */
        strnfmt(
            borg_prepared_buffer, MAX_REASON, "%s still alive!", r_ptr->name);
        return (borg_prepared_buffer);
    }
    return (char *)NULL;
}